

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.c
# Opt level: O3

int parse_global_args(int *argc,char ***argv,GOptionEntry *entries,gboolean ignore_unknown)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  GError *error;
  long local_38;
  
  local_38 = 0;
  uVar2 = g_option_context_new(0);
  g_option_context_add_main_entries(uVar2,entries,0);
  g_option_context_set_ignore_unknown_options(uVar2,ignore_unknown);
  g_option_context_set_help_enabled(uVar2,0);
  iVar1 = g_option_context_parse(uVar2,argc,argv,&local_38);
  if (iVar1 == 0) {
    g_print("%s\n",*(undefined8 *)(local_38 + 8));
    g_option_context_free(uVar2);
    uVar3 = 1;
  }
  else {
    uVar3 = (uint)(*argc == 1);
    g_option_context_free(uVar2);
  }
  return uVar3;
}

Assistant:

int
parse_global_args(int *argc, char ***argv, GOptionEntry *entries,
    gboolean ignore_unknown)
{
	GError *error = NULL;
	GOptionContext *context = g_option_context_new(NULL);
#ifdef G_OS_WIN32
	wchar_t **wargv, **wenv;
	_startupinfo si = { 0 };
	int i;

	__wgetmainargs(argc, &wargv, &wenv, TRUE, &si);
	*argv = g_new(gchar *, *argc + 1);
	for (i = 0; i < *argc; ++i) {
		(*argv)[i] = g_utf16_to_utf8(wargv[i], -1, NULL, NULL, NULL);
	}
	(*argv)[i] = NULL;
#endif

	g_option_context_add_main_entries(context, entries, NULL);
	g_option_context_set_ignore_unknown_options(context, ignore_unknown);
	g_option_context_set_help_enabled(context, FALSE);
	if (!g_option_context_parse(context, argc, argv, &error)) {
		g_print("%s\n", error->message);
		g_option_context_free(context);
		return 1;
	}
	if (*argc == 1) {
		g_option_context_free(context);
		return 1;
	}
	g_option_context_free(context);
	return 0;
}